

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

int __thiscall SQLite::Statement::exec(Statement *this)

{
  int iVar1;
  int iVar2;
  Exception *this_00;
  
  iVar1 = tryExecuteStep(this);
  if (iVar1 == 0x65) {
    iVar1 = sqlite3_changes(this->mpSQLite);
    return iVar1;
  }
  if (iVar1 == 100) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(this_00,"exec() does not expect results. Use executeStep.");
  }
  else {
    iVar2 = sqlite3_errcode(this->mpSQLite);
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    if (iVar1 == iVar2) {
      Exception::Exception(this_00,this->mpSQLite,iVar1);
    }
    else {
      Exception::Exception(this_00,"Statement needs to be reseted",iVar1);
    }
  }
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int Statement::exec()
{
    const int ret = tryExecuteStep();
    if (SQLITE_DONE != ret) // the statement has finished executing successfully
    {
        if (SQLITE_ROW == ret)
        {
            throw SQLite::Exception("exec() does not expect results. Use executeStep.");
        }
        else if (ret == sqlite3_errcode(mpSQLite))
        {
            throw SQLite::Exception(mpSQLite, ret);
        }
        else
        {
            throw SQLite::Exception("Statement needs to be reseted", ret);
        }
    }

    // Return the number of rows modified by those SQL statements (INSERT, UPDATE or DELETE)
    return sqlite3_changes(mpSQLite);
}